

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ons_test.cc
# Opt level: O0

int test_ons_publish_get(void)

{
  code *pcVar1;
  char *__s;
  Ons *pOVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_1c1;
  int ret;
  HttpTestListener *local_1a0;
  HttpTestListener *listener;
  string local_190;
  allocator<char> local_169;
  string local_168 [39];
  allocator<char> local_141;
  string local_140 [55];
  allocator<char> local_109;
  string local_108 [32];
  Ons *local_e8;
  Ons *ons;
  OnsOnsPublishGetResponseType resp;
  OnsOnsPublishGetRequestType req;
  
  aliyun::OnsOnsPublishGetRequestType::OnsOnsPublishGetRequestType
            ((OnsOnsPublishGetRequestType *)((long)&resp.help_url.field_2 + 8));
  aliyun::OnsOnsPublishGetResponseType::OnsOnsPublishGetResponseType
            ((OnsOnsPublishGetResponseType *)&ons);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_108,"cn-hangzhou",&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_140,"my_appid",&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_168,"my_secret",&local_169);
  pOVar2 = (Ons *)aliyun::Ons::CreateOnsClient(local_108,local_140,local_168);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  local_e8 = pOVar2;
  if (pOVar2 == (Ons *)0x0) {
    aliyun::OnsOnsPublishGetResponseType::~OnsOnsPublishGetResponseType
              ((OnsOnsPublishGetResponseType *)&ons);
    aliyun::OnsOnsPublishGetRequestType::~OnsOnsPublishGetRequestType
              ((OnsOnsPublishGetRequestType *)((long)&resp.help_url.field_2 + 8));
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Ons::SetProxyHost(pOVar2,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Ons::SetUseTls(local_e8,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_ons_publish_get_response;
  local_1a0 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_1c1);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_1c1);
  HttpTestListener::Start(local_1a0);
  std::__cxx11::string::operator=((string *)(resp.help_url.field_2._M_local_buf + 8),"OnsRegionId");
  std::__cxx11::string::operator=
            ((string *)(req.ons_region_id.field_2._M_local_buf + 8),"OnsPlatform");
  std::__cxx11::string::operator=
            ((string *)(req.ons_platform.field_2._M_local_buf + 8),"PreventCache");
  std::__cxx11::string::operator=
            ((string *)(req.prevent_cache.field_2._M_local_buf + 8),"ProducerId");
  std::__cxx11::string::operator=((string *)(req.producer_id.field_2._M_local_buf + 8),"Topic");
  aliyun::Ons::OnsPublishGet
            (local_e8,(OnsOnsPublishGetRequestType *)((long)&resp.help_url.field_2 + 8),
             (OnsOnsPublishGetResponseType *)&ons,(OnsErrorInfo *)0x0);
  HttpTestListener::WaitComplete(local_1a0);
  pHVar3 = local_1a0;
  if (local_1a0 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_1a0);
    operator_delete(pHVar3,0x180);
  }
  pOVar2 = local_e8;
  if (local_e8 != (Ons *)0x0) {
    aliyun::Ons::~Ons(local_e8);
    operator_delete(pOVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_ons_publish_get() {
  OnsOnsPublishGetRequestType req;
  OnsOnsPublishGetResponseType resp;
  Ons* ons = Ons::CreateOnsClient("cn-hangzhou", "my_appid", "my_secret");
  if(!ons) return 0;
  ons->SetProxyHost("127.0.0.1:12234");
  ons->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_ons_publish_get_response);
  listener->Start();
  req.ons_region_id = "OnsRegionId";
  req.ons_platform = "OnsPlatform";
  req.prevent_cache = "PreventCache";
  req.producer_id = "ProducerId";
  req.topic = "Topic";
  int ret = ons->OnsPublishGet(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete ons;
}